

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O1

int decode_payload_header(char *stream,int clock,int header_bytes,int size,int fec,btbb_packet *pkt)

{
  uint16_t host_order;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  
  if (header_bytes == 2) {
    if (size < 0x10) {
      return 0;
    }
    if (fec == 0) {
      uVar6 = "cU\x112f:l-\\> vX\vP\x02%E7\b\x14(Jr\x0fj\x1eN5H\x1c\x1aD\a\'qiMG\x19T19,=u\n\x01{|\x16}o\x17*~\x06pL\x180+t"
              [clock & 0x3f] + 0x12;
      uVar1 = pkt->flags;
      lVar4 = 0;
      do {
        bVar5 = stream[lVar4];
        if ((uVar1 & 1) != 0) {
          bVar5 = bVar5 ^ "\x01\x01\x01"[uVar6 % 0x7f];
        }
        pkt->payload_header[lVar4] = bVar5;
        uVar6 = uVar6 % 0x7f + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
    }
    else {
      if (size < 0x1e) {
        return 0;
      }
      pcVar3 = unfec23(stream,0x10);
      if (pcVar3 == (char *)0x0) {
        return 0;
      }
      uVar6 = "cU\x112f:l-\\> vX\vP\x02%E7\b\x14(Jr\x0fj\x1eN5H\x1c\x1aD\a\'qiMG\x19T19,=u\n\x01{|\x16}o\x17*~\x06pL\x180+t"
              [clock & 0x3f] + 0x12;
      uVar1 = pkt->flags;
      lVar4 = 0;
      do {
        bVar5 = pcVar3[lVar4];
        if ((uVar1 & 1) != 0) {
          bVar5 = bVar5 ^ "\x01\x01\x01"[uVar6 % 0x7f];
        }
        pkt->payload_header[lVar4] = bVar5;
        uVar6 = uVar6 % 0x7f + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      free(pcVar3);
      if (pcVar3 == (char *)0x0) {
        return 0;
      }
    }
    lVar4 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 | (int)pkt->payload_header[lVar4 + 3] << ((byte)lVar4 & 0x1f);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    iVar2 = (uVar1 & 0xffff) + 4;
  }
  else {
    if (size < 8) {
      return 0;
    }
    if (fec == 0) {
      uVar6 = "cU\x112f:l-\\> vX\vP\x02%E7\b\x14(Jr\x0fj\x1eN5H\x1c\x1aD\a\'qiMG\x19T19,=u\n\x01{|\x16}o\x17*~\x06pL\x180+t"
              [clock & 0x3f] + 0x12;
      uVar1 = pkt->flags;
      lVar4 = 0;
      do {
        bVar5 = stream[lVar4];
        if ((uVar1 & 1) != 0) {
          bVar5 = bVar5 ^ "\x01\x01\x01"[uVar6 % 0x7f];
        }
        pkt->payload_header[lVar4] = bVar5;
        uVar6 = uVar6 % 0x7f + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
    }
    else {
      if (size < 0xf) {
        return 0;
      }
      pcVar3 = unfec23(stream,8);
      if (pcVar3 == (char *)0x0) {
        return 0;
      }
      uVar6 = "cU\x112f:l-\\> vX\vP\x02%E7\b\x14(Jr\x0fj\x1eN5H\x1c\x1aD\a\'qiMG\x19T19,=u\n\x01{|\x16}o\x17*~\x06pL\x180+t"
              [clock & 0x3f] + 0x12;
      uVar1 = pkt->flags;
      lVar4 = 0;
      do {
        bVar5 = pcVar3[lVar4];
        if ((uVar1 & 1) != 0) {
          bVar5 = bVar5 ^ "\x01\x01\x01"[uVar6 % 0x7f];
        }
        pkt->payload_header[lVar4] = bVar5;
        uVar6 = uVar6 % 0x7f + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      free(pcVar3);
      if (pcVar3 == (char *)0x0) {
        return 0;
      }
    }
    lVar4 = 0;
    bVar5 = 0;
    do {
      bVar5 = bVar5 | pkt->payload_header[lVar4 + 3] << ((byte)lVar4 & 0x1f);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    iVar2 = bVar5 + 3;
  }
  pkt->payload_length = iVar2;
  bVar5 = pkt->packet_type - 3;
  iVar2 = 0;
  if (bVar5 < 0xd) {
    iVar2 = (&DAT_0010b700)[bVar5];
  }
  if (pkt->payload_length < iVar2) {
    iVar2 = pkt->payload_length;
  }
  pkt->payload_length = iVar2;
  lVar4 = 0;
  bVar5 = 0;
  do {
    bVar5 = bVar5 | pkt->payload_header[lVar4] << ((byte)lVar4 & 0x1f);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  pkt->payload_llid = bVar5;
  pkt->payload_flow = pkt->payload_header[2];
  pkt->payload_header_length = header_bytes;
  return 1;
}

Assistant:

static int decode_payload_header(char *stream, int clock, int header_bytes, int size, int fec, btbb_packet* pkt)
{
	if(header_bytes == 2)
	{
		if(size < 16)
			return 0; //FIXME should throw exception
		if(fec) {
			if(size < 30)
				return 0; //FIXME should throw exception
			char *corrected = unfec23(stream, 16);
			if (!corrected)
				return 0;
			unwhiten(corrected, pkt->payload_header, clock, 16, 18, pkt);
			free(corrected);
		} else {
			unwhiten(stream, pkt->payload_header, clock, 16, 18, pkt);
		}
		/* payload length is payload body length + 2 bytes payload header + 2 bytes CRC */
		pkt->payload_length = air_to_host16(&pkt->payload_header[3], 10) + 4;
	} else {
		if(size < 8)
			return 0; //FIXME should throw exception
		if(fec) {
			if(size < 15)
				return 0; //FIXME should throw exception
			char *corrected = unfec23(stream, 8);
			if (!corrected)
				return 0;
			unwhiten(corrected, pkt->payload_header, clock, 8, 18, pkt);
			free(corrected);
		} else {
			unwhiten(stream, pkt->payload_header, clock, 8, 18, pkt);
		}
		/* payload length is payload body length + 1 byte payload header + 2 bytes CRC */
		pkt->payload_length = air_to_host8(&pkt->payload_header[3], 5) + 3;
	}
	/* Try to set the max payload length to a sensible value,
	 * especially when using strange data
	 */
	int max_length = 0;
	switch(pkt->packet_type) {
		case PACKET_TYPE_DM1:
			max_length = 20;
			break;
		case PACKET_TYPE_DH1:
			/* assuming DH1 but could be 2-DH1 (58) */
			max_length = 30;
			break;
		case PACKET_TYPE_DV:
			/* assuming DV but could be 3-DH1 (87) */
			max_length = 12; /* + 10bytes of voice data */
			break;
		case PACKET_TYPE_DM3:
			/* assuming DM3 but could be 2-DH3 (371) */
			max_length = 125;
			break;
		case PACKET_TYPE_DH3:
			/* assuming DH3 but could be 3-DH3 (556) */
			max_length = 187;
			break;
		case PACKET_TYPE_DM5:
			/* assuming DM5 but could be 2-DH5 (683) */
			max_length = 228;
			break;
		case PACKET_TYPE_DH5:
			/* assuming DH5 but could be 3-DH5 (1025) */
			max_length = 343;
			break;
	}
	pkt->payload_length = MIN(pkt->payload_length, max_length);
	pkt->payload_llid = air_to_host8(&pkt->payload_header[0], 2);
	pkt->payload_flow = air_to_host8(&pkt->payload_header[2], 1);
	pkt->payload_header_length = header_bytes;
	return 1;
}